

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O0

void trimLine(void)

{
  size_t sVar1;
  int local_c;
  int index;
  
  sVar1 = strlen(inputBuffer);
  local_c = (int)sVar1;
  while ((local_c = local_c + -1, 0 < local_c &&
         (((inputBuffer[local_c] == ' ' || (inputBuffer[local_c] == '\t')) ||
          (inputBuffer[local_c] == '\n'))))) {
    inputBuffer[local_c] = '\0';
  }
  return;
}

Assistant:

void trimLine()
{
    int index = (int)strlen(inputBuffer) - 1;

    while(index > 0) {
        if((inputBuffer[index] == ' ') || (inputBuffer[index] == '\t') || (inputBuffer[index] == '\n')) {
            inputBuffer[index--] = 0;
        } else {
            break;
        }
    }
}